

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O1

ProFile * __thiscall
QMakeParser::parsedProFile(QMakeParser *this,QString *fileName,ParseFlags flags)

{
  ArrayOptions *pAVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  bool bVar6;
  ProFile *pPVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  iterator iVar9;
  QStringView contents;
  QStringView contents_00;
  int id;
  int local_5c;
  TryEmplaceResult local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = QMakeVfs::idForFileName(this->m_vfs,fileName,(VfsFlags)0x0);
  if ((((uint)flags.super_QFlagsStorageHelper<QMakeParser::ParseFlag,_4>.
              super_QFlagsStorage<QMakeParser::ParseFlag>.i & 1) == 0) ||
     (&this->m_cache->parsed_files == (QHash<int,_ProFileCache::Entry> *)0x0)) {
    local_58.iterator.i.d = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0;
    local_58.iterator.i.bucket = 0;
    local_58._16_8_ = 0;
    bVar6 = readFile(this,local_5c,flags,(QString *)&local_58);
    if (bVar6) {
      contents.m_data = (storage_type_conflict *)local_58.iterator.i.bucket;
      contents.m_size = local_58._16_8_;
      pPVar7 = parsedProBlock(this,contents,local_5c,fileName,1,FullGrammar);
    }
    else {
      pPVar7 = (ProFile *)0x0;
    }
  }
  else {
    iVar9 = QHash<int,_ProFileCache::Entry>::findImpl<int>(&this->m_cache->parsed_files,&local_5c);
    if (iVar9.i.d != (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0 ||
        iVar9.i.bucket != 0) {
      pSVar3 = (iVar9.i.d)->spans;
      uVar8 = iVar9.i.bucket >> 7;
      pPVar7 = *(ProFile **)
                (pSVar3[uVar8].entries[pSVar3[uVar8].offsets[(uint)iVar9.i.bucket & 0x7f]].storage.
                 data + 8);
      if (pPVar7 == (ProFile *)0x0) {
        pPVar7 = (ProFile *)0x0;
      }
      else {
        (pPVar7->m_refCount).m_cnt = (pPVar7->m_refCount).m_cnt + 1;
      }
      goto LAB_0028b3dc;
    }
    QHash<int,ProFileCache::Entry>::tryEmplace_impl<int_const&>(&local_58,this->m_cache,&local_5c);
    pEVar4 = (local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries;
    bVar2 = (local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].offsets
            [(uint)local_58.iterator.i.bucket & 0x7f];
    local_58.iterator.i.d = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0;
    local_58.iterator.i.bucket = 0;
    local_58._16_8_ = 0;
    bVar6 = readFile(this,local_5c,flags,(QString *)&local_58);
    if (bVar6) {
      contents_00.m_data = (storage_type_conflict *)local_58.iterator.i.bucket;
      contents_00.m_size = local_58._16_8_;
      pPVar7 = parsedProBlock(this,contents_00,local_5c,fileName,1,FullGrammar);
      pDVar5 = (pPVar7->m_proitems).d.d;
      if (pDVar5 != (Data *)0x0) {
        if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
           ((pPVar7->m_proitems).d.size < (pDVar5->super_QArrayData).alloc)) {
          QString::reallocData
                    ((longlong)&pPVar7->m_proitems,(AllocationOption)(pPVar7->m_proitems).d.size);
        }
        pDVar5 = (pPVar7->m_proitems).d.d;
        if ((pDVar5 != (Data *)0x0) && ((pDVar5->super_QArrayData).alloc != 0)) {
          pAVar1 = &(pDVar5->super_QArrayData).flags;
          *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                    super_QFlagsStorage<QArrayData::ArrayOption>.i =
               (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                     super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
        }
      }
      (pPVar7->m_refCount).m_cnt = (pPVar7->m_refCount).m_cnt + 1;
    }
    else {
      pPVar7 = (ProFile *)0x0;
    }
    *(ProFile **)(pEVar4[bVar2].storage.data + 8) = pPVar7;
  }
  if (local_58.iterator.i.d != (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0) {
    LOCK();
    ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58.iterator.i.d,2,0x10);
    }
  }
LAB_0028b3dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pPVar7;
  }
  __stack_chk_fail();
}

Assistant:

ProFile *QMakeParser::parsedProFile(const QString &fileName, ParseFlags flags)
{
    ProFile *pro;
    QMakeVfs::VfsFlags vfsFlags = ((flags & ParseCumulative) ? QMakeVfs::VfsCumulative
                                                             : QMakeVfs::VfsExact);
    int id = m_vfs->idForFileName(fileName, vfsFlags);
    if ((flags & ParseUseCache) && m_cache) {
        ProFileCache::Entry *ent;
#ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_cache->mutex);
#endif
        auto it = m_cache->parsed_files.find(id);
        if (it != m_cache->parsed_files.end()) {
            ent = &*it;
#ifdef PROPARSER_THREAD_SAFE
            if (ent->locker && !ent->locker->done) {
                ++ent->locker->waiters;
                QThreadPool::globalInstance()->releaseThread();
                ent->locker->cond.wait(locker.mutex());
                QThreadPool::globalInstance()->reserveThread();
                if (!--ent->locker->waiters) {
                    delete ent->locker;
                    ent->locker = 0;
                }
            }
#endif
            if ((pro = ent->pro))
                pro->ref();
        } else {
            ent = &m_cache->parsed_files[id];
#ifdef PROPARSER_THREAD_SAFE
            ent->locker = new ProFileCache::Entry::Locker;
            locker.unlock();
#endif
            QString contents;
            if (readFile(id, flags, &contents)) {
                pro = parsedProBlock(QStringView(contents), id, fileName, 1, FullGrammar);
                pro->itemsRef()->squeeze();
                pro->ref();
            } else {
                pro = nullptr;
            }
            ent->pro = pro;
#ifdef PROPARSER_THREAD_SAFE
            locker.relock();
            if (ent->locker->waiters) {
                ent->locker->done = true;
                ent->locker->cond.wakeAll();
            } else {
                delete ent->locker;
                ent->locker = 0;
            }
#endif
        }
    } else {
        QString contents;
        if (readFile(id, flags, &contents))
            pro = parsedProBlock(QStringView(contents), id, fileName, 1, FullGrammar);
        else
            pro = nullptr;
    }
    return pro;
}